

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O2

void erkStep_PrintMem(ARKodeMem ark_mem,FILE *outfile)

{
  int iVar1;
  ARKodeERKStepMem in_RAX;
  ARKodeERKStepMem step_mem;
  
  step_mem = in_RAX;
  iVar1 = erkStep_AccessStepMem(ark_mem,"erkStep_PrintMem",&step_mem);
  if (iVar1 != 0) {
    return;
  }
  fprintf((FILE *)outfile,"ERKStep: q = %i\n",(ulong)(uint)step_mem->q);
  fprintf((FILE *)outfile,"ERKStep: p = %i\n",(ulong)(uint)step_mem->p);
  fprintf((FILE *)outfile,"ERKStep: stages = %i\n",(ulong)(uint)step_mem->stages);
  fprintf((FILE *)outfile,"ERKStep: nfe = %li\n",step_mem->nfe);
  fwrite("ERKStep: Butcher table:\n",0x18,1,(FILE *)outfile);
  ARKodeButcherTable_Write(step_mem->B,outfile);
  return;
}

Assistant:

void erkStep_PrintMem(ARKodeMem ark_mem, FILE* outfile)
{
  ARKodeERKStepMem step_mem;
  int retval;

#ifdef SUNDIALS_DEBUG_PRINTVEC
  int i;
#endif

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return; }

  /* output integer quantities */
  fprintf(outfile, "ERKStep: q = %i\n", step_mem->q);
  fprintf(outfile, "ERKStep: p = %i\n", step_mem->p);
  fprintf(outfile, "ERKStep: stages = %i\n", step_mem->stages);

  /* output long integer quantities */
  fprintf(outfile, "ERKStep: nfe = %li\n", step_mem->nfe);

  /* output sunrealtype quantities */
  fprintf(outfile, "ERKStep: Butcher table:\n");
  ARKodeButcherTable_Write(step_mem->B, outfile);

#ifdef SUNDIALS_DEBUG_PRINTVEC
  /* output vector quantities */
  for (i = 0; i < step_mem->stages; i++)
  {
    fprintf(outfile, "ERKStep: F[%i]:\n", i);
    N_VPrintFile(step_mem->F[i], outfile);
  }
#endif
}